

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

bool __thiscall
wasm::String::anon_unknown_0::doConvertWTF16ToWTF8
          (anon_unknown_0 *this,ostream *os,string_view str,bool allowWTF)

{
  _Storage<unsigned_int,_true> u;
  optional<unsigned_int> oVar1;
  bool bVar2;
  undefined1 local_40 [8];
  string_view str_local;
  
  str_local._M_len = str._M_len;
  if (os == (ostream *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = true;
    local_40 = (undefined1  [8])os;
    do {
      oVar1 = takeWTF16CodePoint((string_view *)local_40,str._M_str._0_1_);
      u._M_value = oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload;
      if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        u._M_value = 0xfffd;
        bVar2 = false;
      }
      writeWTF8CodePoint((ostream *)this,u._M_value);
    } while (local_40 != (undefined1  [8])0x0);
  }
  return bVar2;
}

Assistant:

bool doConvertWTF16ToWTF8(std::ostream& os,
                          std::string_view str,
                          bool allowWTF) {
  bool valid = true;

  while (str.size()) {
    auto u = takeWTF16CodePoint(str, allowWTF);
    if (!u) {
      valid = false;
      u = replacementCharacter;
    }
    writeWTF8CodePoint(os, *u);
  }

  return valid;
}